

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLCellABecLap.cpp
# Opt level: O2

void __thiscall amrex::MLCellABecLap::applyOverset(MLCellABecLap *this,int amrlev,Any *a_rhs)

{
  uint uVar1;
  FabArray<amrex::FArrayBox> *this_00;
  long lVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  Box local_12c;
  Array4<double> local_110;
  Array4<const_int> local_d0;
  MFIter mfi;
  
  if (**(long **)&(this->m_overset_mask).
                  super_vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                  .
                  super__Vector_base<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[amrlev].
                  super_vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                  .
                  super__Vector_base<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
      != 0) {
    this_00 = &Any::get<amrex::MultiFab>(a_rhs)->super_FabArray<amrex::FArrayBox>;
    uVar1 = (*(this->super_MLCellLinOp).super_MLLinOp._vptr_MLLinOp[5])(this);
    MFIter::MFIter(&mfi,(FabArrayBase *)
                        **(undefined8 **)
                          &(this->m_overset_mask).
                           super_vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                           .
                           super__Vector_base<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[amrlev].
                           super_vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                           .
                           super__Vector_base<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                   ,true);
    if ((int)uVar1 < 1) {
      uVar1 = 0;
    }
    while (mfi.currentIndex < mfi.endIndex) {
      MFIter::tilebox(&local_12c,&mfi);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&local_110,this_00,&mfi);
      FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
                (&local_d0,
                 (FabArray<amrex::IArrayBox> *)
                 **(undefined8 **)
                   &(this->m_overset_mask).
                    super_vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                    .
                    super__Vector_base<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[amrlev].
                    super_vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                    .
                    super__Vector_base<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                 ,&mfi);
      lVar5 = 0;
      uVar3 = 0;
      while( true ) {
        lVar7 = (long)local_12c.smallend.vect[2];
        if (uVar3 == uVar1) break;
        for (; (int)lVar7 <= local_12c.bigend.vect[2]; lVar7 = lVar7 + 1) {
          lVar4 = (long)local_d0.p +
                  ((long)local_12c.smallend.vect[1] - (long)local_d0.begin.y) * local_d0.jstride * 4
                  + (lVar7 - local_d0.begin.z) * local_d0.kstride * 4 + (long)local_d0.begin.x * -4
                  + (long)local_12c.smallend.vect[0] * 4;
          for (lVar2 = (long)local_12c.smallend.vect[1]; lVar2 <= local_12c.bigend.vect[1];
              lVar2 = lVar2 + 1) {
            if (local_12c.smallend.vect[0] <= local_12c.bigend.vect[0]) {
              lVar6 = 0;
              do {
                if (*(int *)(lVar4 + lVar6 * 4) == 0) {
                  *(undefined8 *)
                   ((long)local_110.p +
                   lVar6 * 8 +
                   local_110.nstride * lVar5 +
                   (lVar7 - local_110.begin.z) * local_110.kstride * 8 +
                   (lVar2 - local_110.begin.y) * local_110.jstride * 8 +
                   (long)local_110.begin.x * -8 + (long)local_12c.smallend.vect[0] * 8) = 0;
                }
                lVar6 = lVar6 + 1;
              } while ((local_12c.bigend.vect[0] - local_12c.smallend.vect[0]) + 1 != (int)lVar6);
            }
            lVar4 = lVar4 + local_d0.jstride * 4;
          }
        }
        uVar3 = uVar3 + 1;
        lVar5 = lVar5 + 8;
      }
      MFIter::operator++(&mfi);
    }
    MFIter::~MFIter(&mfi);
  }
  return;
}

Assistant:

void
MLCellABecLap::applyOverset (int amrlev, Any& a_rhs) const
{
    if (m_overset_mask[amrlev][0]) {
        AMREX_ASSERT(a_rhs.is<MultiFab>());
        auto& rhs = a_rhs.get<MultiFab>();
        const int ncomp = getNComp();
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
        for (MFIter mfi(*m_overset_mask[amrlev][0],TilingIfNotGPU()); mfi.isValid(); ++mfi)
        {
            const Box& bx = mfi.tilebox();
            Array4<Real> const& rfab = rhs.array(mfi);
            Array4<int const> const& osm = m_overset_mask[amrlev][0]->const_array(mfi);
            AMREX_HOST_DEVICE_PARALLEL_FOR_4D(bx, ncomp, i, j, k, n,
            {
                if (osm(i,j,k) == 0) rfab(i,j,k,n) = 0.0;
            });
        }
    }
}